

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.cpp
# Opt level: O1

Point __thiscall Point::randomPoint(Point *this,int max_x,int max_y)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  do {
    iVar1 = rand();
    dVar5 = ((double)(iVar1 % 1000000) + (double)(iVar1 % 1000000)) / 1000000.0 + -1.0;
    iVar1 = rand();
    dVar6 = ((double)(iVar1 % 1000000) + (double)(iVar1 % 1000000)) / 1000000.0 + -1.0;
    dVar2 = dVar5 * dVar5 + dVar6 * dVar6;
    if (dVar2 < 0.0) {
      dVar2 = sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
  } while (1.0 < dVar2);
  dVar3 = log(dVar2);
  dVar3 = (dVar3 * -2.0) / dVar2;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  dVar4 = log(dVar2);
  dVar2 = (dVar4 * -2.0) / dVar2;
  if (dVar2 < 0.0) {
    dVar2 = sqrt(dVar2);
  }
  else {
    dVar2 = SQRT(dVar2);
  }
  dVar5 = ceil(dVar5 * dVar3 * (double)max_x);
  dVar2 = ceil((double)max_y * dVar6 * dVar2);
  this->x = (int)dVar5;
  this->y = (int)dVar2;
  return (Point)this;
}

Assistant:

Point Point::randomPoint(int max_x, int max_y){
	double v1 = 2*((double)(rand()%MAAAX))/MAAAX - 1;
	double v2 = 2*((double)(rand()%MAAAX))/	MAAAX - 1;
	double s = sqrt(v1*v1 + v2*v2);
	if (s > 1){
		return randomPoint(max_x, max_y);
	}
	double u1 = v1*sqrt(-2*log(s)/s);
	double u2 = v2*sqrt(-2*log(s)/s);
	u1 = u1;
	u2 = u2;
	int x = ceil(max_x*u1);
	int y = ceil(max_y*u2);
	return Point(x, y);
}